

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

void Curl_hexencode(uchar *src,size_t len,uchar *out,size_t olen)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (olen < 3 || (len == 0 || src == (uchar *)0x0)) {
    if (olen == 0) {
      return;
    }
  }
  else {
    lVar4 = 0;
    lVar2 = 0;
    do {
      out[lVar4 * 2] = "0123456789abcdef"[src[lVar4] >> 4];
      out[lVar4 * 2 + 1] = "0123456789abcdef"[src[lVar4] & 0xf];
      lVar1 = lVar2 + -2;
      if (len - 1 == lVar4) break;
      uVar3 = lVar2 + (olen - 2);
      lVar4 = lVar4 + 1;
      lVar2 = lVar1;
    } while (2 < uVar3);
    out = out + -lVar1;
  }
  *out = '\0';
  return;
}

Assistant:

void Curl_hexencode(const unsigned char *src, size_t len, /* input length */
                    unsigned char *out, size_t olen) /* output buffer size */
{
  const char *hex = "0123456789abcdef";
  DEBUGASSERT(src && len && (olen >= 3));
  if(src && len && (olen >= 3)) {
    while(len-- && (olen >= 3)) {
      /* clang-tidy warns on this line without this comment: */
      /* NOLINTNEXTLINE(clang-analyzer-core.UndefinedBinaryOperatorResult) */
      *out++ = hex[(*src & 0xF0)>>4];
      *out++ = hex[*src & 0x0F];
      ++src;
      olen -= 2;
    }
    *out = 0;
  }
  else if(olen)
    *out = 0;
}